

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

void __thiscall doctest::detail::printHelp(detail *this)

{
  char *pcVar1;
  Color *pCVar2;
  
  printVersion(this);
  Color::use((Color *)this,Cyan);
  pcVar1 = "[doctest]";
  puts("[doctest]");
  Color::use((Color *)pcVar1,None);
  Color::use((Color *)pcVar1,Cyan);
  pCVar2 = (Color *)0x14a3de;
  printf("%s");
  Color::use(pCVar2,None);
  pcVar1 = "boolean values: \"1/on/yes/true\" or \"0/off/no/false\"";
  puts("boolean values: \"1/on/yes/true\" or \"0/off/no/false\"");
  Color::use((Color *)pcVar1,Cyan);
  pCVar2 = (Color *)0x14a3de;
  printf("%s");
  Color::use(pCVar2,None);
  pcVar1 = "filter  values: \"str1,str2,str3\" (comma separated strings)";
  puts("filter  values: \"str1,str2,str3\" (comma separated strings)");
  Color::use((Color *)pcVar1,Cyan);
  pcVar1 = "[doctest]";
  puts("[doctest]");
  Color::use((Color *)pcVar1,None);
  Color::use((Color *)pcVar1,Cyan);
  pCVar2 = (Color *)0x14a3de;
  printf("%s");
  Color::use(pCVar2,None);
  pcVar1 = "filters use wildcards for matching strings";
  puts("filters use wildcards for matching strings");
  Color::use((Color *)pcVar1,Cyan);
  pCVar2 = (Color *)0x14a3de;
  printf("%s");
  Color::use(pCVar2,None);
  pcVar1 = "something passes a filter if any of the strings in a filter matches";
  puts("something passes a filter if any of the strings in a filter matches");
  Color::use((Color *)pcVar1,Cyan);
  pcVar1 = "[doctest]";
  puts("[doctest]");
  Color::use((Color *)pcVar1,None);
  Color::use((Color *)pcVar1,Cyan);
  pCVar2 = (Color *)0x14a3de;
  printf("%s");
  Color::use(pCVar2,None);
  pcVar1 = "ALL FLAGS, OPTIONS AND FILTERS ALSO AVAILABLE WITH A \"dt-\" PREFIX!!!";
  puts("ALL FLAGS, OPTIONS AND FILTERS ALSO AVAILABLE WITH A \"dt-\" PREFIX!!!");
  Color::use((Color *)pcVar1,Cyan);
  pcVar1 = "[doctest]";
  puts("[doctest]");
  Color::use((Color *)pcVar1,None);
  Color::use((Color *)pcVar1,Cyan);
  pCVar2 = (Color *)0x14a3de;
  printf("%s");
  Color::use(pCVar2,None);
  puts("Query flags - the program quits after them. Available:\n");
  puts(" -?,   --help, -h                      prints this message");
  puts(" -v,   --version                       prints the version");
  puts(" -c,   --count                         prints the number of matching tests");
  puts(" -ltc, --list-test-cases               lists all matching tests by name");
  pcVar1 = " -lts, --list-test-suites              lists all matching test suites\n";
  puts(" -lts, --list-test-suites              lists all matching test suites\n");
  Color::use((Color *)pcVar1,Cyan);
  pCVar2 = (Color *)0x14a3de;
  printf("%s");
  Color::use(pCVar2,None);
  puts("The available <int>/<string> options/filters are:\n");
  puts(" -tc,  --test-case=<filters>           filters     tests by their name");
  puts(" -tce, --test-case-exclude=<filters>   filters OUT tests by their name");
  puts(" -sf,  --source-file=<filters>         filters     tests by their file");
  puts(" -sfe, --source-file-exclude=<filters> filters OUT tests by their file");
  puts(" -ts,  --test-suite=<filters>          filters     tests by their test suite");
  puts(" -tse, --test-suite-exclude=<filters>  filters OUT tests by their test suite");
  puts(" -ob,  --order-by=<string>             how the tests should be ordered");
  puts("                                       <string> - by [file/suite/name/rand]");
  puts(" -rs,  --rand-seed=<int>               seed for random ordering");
  puts(" -f,   --first=<int>                   the first test passing the filters to");
  puts("                                       execute - for range-based execution");
  puts(" -l,   --last=<int>                    the last test passing the filters to");
  puts("                                       execute - for range-based execution");
  pcVar1 = " -aa,  --abort-after=<int>             stop after <int> failed assertions\n";
  puts(" -aa,  --abort-after=<int>             stop after <int> failed assertions\n");
  Color::use((Color *)pcVar1,Cyan);
  pCVar2 = (Color *)0x14a3de;
  printf("%s");
  Color::use(pCVar2,None);
  puts("Bool options - can be used like flags and true is assumed. Available:\n");
  puts(" -s,   --success=<bool>                include successful assertions in output");
  puts(" -cs,  --case-sensitive=<bool>         filters being treated as case sensitive");
  puts(" -e,   --exit=<bool>                   exits after the tests finish");
  puts(" -nt,  --no-throw=<bool>               skips exceptions-related assert checks");
  puts(" -ne,  --no-exitcode=<bool>            returns (or exits) always with success");
  puts(" -nr,  --no-run=<bool>                 skips all runtime doctest operations");
  puts(" -nv,  --no-version=<bool>             omit the framework version in the output");
  puts(" -nc,  --no-colors=<bool>              disables colors in output");
  puts(" -nb,  --no-breaks=<bool>              disables breakpoints in debuggers");
  pcVar1 = " -npf, --no-path-filenames=<bool>      only filenames and no paths in output\n";
  puts(" -npf, --no-path-filenames=<bool>      only filenames and no paths in output\n");
  Color::use((Color *)pcVar1,Cyan);
  pCVar2 = (Color *)0x14a3de;
  printf("%s");
  Color::use(pCVar2,None);
  puts("for more information visit the project documentation\n");
  return;
}

Assistant:

void printHelp() {
        printVersion();
        DOCTEST_PRINTF_COLORED("[doctest]\n", Color::Cyan);
        DOCTEST_PRINTF_COLORED("[doctest] ", Color::Cyan);
        printf("boolean values: \"1/on/yes/true\" or \"0/off/no/false\"\n");
        DOCTEST_PRINTF_COLORED("[doctest] ", Color::Cyan);
        printf("filter  values: \"str1,str2,str3\" (comma separated strings)\n");
        DOCTEST_PRINTF_COLORED("[doctest]\n", Color::Cyan);
        DOCTEST_PRINTF_COLORED("[doctest] ", Color::Cyan);
        printf("filters use wildcards for matching strings\n");
        DOCTEST_PRINTF_COLORED("[doctest] ", Color::Cyan);
        printf("something passes a filter if any of the strings in a filter matches\n");
        DOCTEST_PRINTF_COLORED("[doctest]\n", Color::Cyan);
        DOCTEST_PRINTF_COLORED("[doctest] ", Color::Cyan);
        printf("ALL FLAGS, OPTIONS AND FILTERS ALSO AVAILABLE WITH A \"dt-\" PREFIX!!!\n");
        DOCTEST_PRINTF_COLORED("[doctest]\n", Color::Cyan);
        DOCTEST_PRINTF_COLORED("[doctest] ", Color::Cyan);
        printf("Query flags - the program quits after them. Available:\n\n");
        printf(" -?,   --help, -h                      prints this message\n");
        printf(" -v,   --version                       prints the version\n");
        printf(" -c,   --count                         prints the number of matching tests\n");
        printf(" -ltc, --list-test-cases               lists all matching tests by name\n");
        printf(" -lts, --list-test-suites              lists all matching test suites\n\n");
        // ==================================================================================== << 79
        DOCTEST_PRINTF_COLORED("[doctest] ", Color::Cyan);
        printf("The available <int>/<string> options/filters are:\n\n");
        printf(" -tc,  --test-case=<filters>           filters     tests by their name\n");
        printf(" -tce, --test-case-exclude=<filters>   filters OUT tests by their name\n");
        printf(" -sf,  --source-file=<filters>         filters     tests by their file\n");
        printf(" -sfe, --source-file-exclude=<filters> filters OUT tests by their file\n");
        printf(" -ts,  --test-suite=<filters>          filters     tests by their test suite\n");
        printf(" -tse, --test-suite-exclude=<filters>  filters OUT tests by their test suite\n");
        printf(" -ob,  --order-by=<string>             how the tests should be ordered\n");
        printf("                                       <string> - by [file/suite/name/rand]\n");
        printf(" -rs,  --rand-seed=<int>               seed for random ordering\n");
        printf(" -f,   --first=<int>                   the first test passing the filters to\n");
        printf("                                       execute - for range-based execution\n");
        printf(" -l,   --last=<int>                    the last test passing the filters to\n");
        printf("                                       execute - for range-based execution\n");
        printf(" -aa,  --abort-after=<int>             stop after <int> failed assertions\n\n");
        DOCTEST_PRINTF_COLORED("[doctest] ", Color::Cyan);
        printf("Bool options - can be used like flags and true is assumed. Available:\n\n");
        printf(" -s,   --success=<bool>                include successful assertions in output\n");
        printf(" -cs,  --case-sensitive=<bool>         filters being treated as case sensitive\n");
        printf(" -e,   --exit=<bool>                   exits after the tests finish\n");
        printf(" -nt,  --no-throw=<bool>               skips exceptions-related assert checks\n");
        printf(" -ne,  --no-exitcode=<bool>            returns (or exits) always with success\n");
        printf(" -nr,  --no-run=<bool>                 skips all runtime doctest operations\n");
        printf(" -nv,  --no-version=<bool>             omit the framework version in the output\n");
        printf(" -nc,  --no-colors=<bool>              disables colors in output\n");
        printf(" -nb,  --no-breaks=<bool>              disables breakpoints in debuggers\n");
        printf(" -npf, --no-path-filenames=<bool>      only filenames and no paths in output\n\n");
        // ==================================================================================== << 79

        DOCTEST_PRINTF_COLORED("[doctest] ", Color::Cyan);
        printf("for more information visit the project documentation\n\n");
    }